

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O1

TestCaseGroup * vkt::api::createBufferTests(TestContext *testCtx)

{
  uint uVar1;
  TestNode *this;
  ostream *poVar2;
  TestNode *node;
  long lVar3;
  long lVar4;
  ostringstream testDescription;
  ostringstream testName;
  long *local_360;
  long local_350 [2];
  long *local_340;
  long local_330 [2];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"buffer","Buffer Tests");
  lVar3 = 0;
  do {
    uVar1 = (&DAT_00acea80)[lVar3];
    lVar4 = 1;
    do {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__cxx11::ostringstream::ostringstream(local_320);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"create_buffer_",0xe);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"vkCreateBuffer test ",0x14);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      node = (TestNode *)operator_new(0x80);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      tcu::TestCase::TestCase((TestCase *)node,testCtx,(char *)local_340,(char *)local_360);
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1e350;
      node[1]._vptr_TestNode = (_func_int **)(((ulong)uVar1 << 0x20) + lVar4);
      *(undefined4 *)&node[1].m_testCtx = 0;
      tcu::TestNode::addChild(this,node);
      if (local_360 != local_350) {
        operator_delete(local_360,local_350[0] + 1);
      }
      if (local_340 != local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_320);
      std::ios_base::~ios_base(local_2b0);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createBufferTests (tcu::TestContext& testCtx)
{
	const VkBufferUsageFlags bufferUsageModes[] =
	{
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,
		VK_BUFFER_USAGE_TRANSFER_DST_BIT,
		VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT,
		VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT,
		VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT,
		VK_BUFFER_USAGE_INDEX_BUFFER_BIT,
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,
		VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT
	};

	// \note SPARSE_RESIDENCY and SPARSE_ALIASED have to be used together with the SPARSE_BINDING flag.
	const VkBufferCreateFlags bufferCreateFlags[] =
	{
		0,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|	VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|												VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|	VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT	|	VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,
	};

	de::MovePtr<tcu::TestCaseGroup>	buffersTests	(new tcu::TestCaseGroup(testCtx, "buffer", "Buffer Tests"));

	const deUint32 maximumValueOfBufferUsageFlags	= (1u << (DE_LENGTH_OF_ARRAY(bufferUsageModes) - 1)) - 1u;

	for (deUint32 bufferCreateFlagsNdx = 0u; bufferCreateFlagsNdx < DE_LENGTH_OF_ARRAY(bufferCreateFlags); bufferCreateFlagsNdx++)
	for (deUint32 combinedBufferUsageFlags = 1u; combinedBufferUsageFlags <= maximumValueOfBufferUsageFlags; combinedBufferUsageFlags++)
	{
		const BufferCaseParameters	testParams =
		{
			combinedBufferUsageFlags,
			bufferCreateFlags[bufferCreateFlagsNdx],
			VK_SHARING_MODE_EXCLUSIVE
		};
		std::ostringstream	testName;
		std::ostringstream	testDescription;
		testName << "create_buffer_" << combinedBufferUsageFlags << "_" << testParams.flags;
		testDescription << "vkCreateBuffer test " << combinedBufferUsageFlags << " " << testParams.flags;
		buffersTests->addChild(new BuffersTestCase(testCtx, testName.str(), testDescription.str(), testParams));
	}

	return buffersTests.release();
}